

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

void __thiscall
flatbuffers::dart::DartGenerator::import_generator<flatbuffers::EnumDef>
          (DartGenerator *this,
          vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *definitions,
          string *included,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppEVar2;
  size_t __n;
  size_type sVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  ulong *puVar8;
  long *plVar9;
  undefined8 uVar10;
  ulong uVar11;
  pointer ppEVar12;
  IdlNamer *this_00;
  string filename;
  string component;
  string filebase;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppEVar12 = (definitions->
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (definitions->
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar12 != ppEVar2) {
    this_00 = &this->namer_;
    local_78 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)imports;
    do {
      __n = ((*ppEVar12)->super_Definition).file._M_string_length;
      if ((__n == included->_M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp(((*ppEVar12)->super_Definition).file._M_dataplus._M_p,
                        (included->_M_dataplus)._M_p,__n), iVar4 == 0)))) {
        (*(this_00->super_Namer)._vptr_Namer[10])
                  (&local_b8,this_00,((*ppEVar12)->super_Definition).defined_namespace);
        StripExtension(&local_f8,&((*ppEVar12)->super_Definition).file);
        StripPath(&local_98,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        paVar1 = &local_138.field_2;
        if (local_b8._M_string_length == 0) {
          local_138._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_138);
        }
        else {
          std::operator+(&local_138,"_",&local_b8);
        }
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_138,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p
                                   );
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_158.field_2._M_allocated_capacity = *psVar7;
          local_158.field_2._8_8_ = plVar5[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar7;
          local_158._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_158._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        Namer::File(&local_f8,&this_00->super_Namer,&local_158,None);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_50,"import \'./",&local_f8);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        sVar3 = local_b8._M_string_length;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_138.field_2._M_allocated_capacity = *puVar8;
          local_138.field_2._8_4_ = (undefined4)plVar5[3];
          local_138.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
          local_138._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_138.field_2._M_allocated_capacity = *puVar8;
          local_138._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_138._M_string_length = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_b8._M_string_length == 0) {
          local_118 = &local_108;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,";\n","");
        }
        else {
          ImportAliasName(&local_70,&local_b8);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x377737);
          local_d8 = &local_c8;
          plVar9 = plVar5 + 2;
          if ((long *)*plVar5 == plVar9) {
            local_c8 = *plVar9;
            lStack_c0 = plVar5[3];
          }
          else {
            local_c8 = *plVar9;
            local_d8 = (long *)*plVar5;
          }
          local_d0 = plVar5[1];
          *plVar5 = (long)plVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_118 = &local_108;
          puVar8 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar8) {
            local_108 = *puVar8;
            lStack_100 = plVar5[3];
          }
          else {
            local_108 = *puVar8;
            local_118 = (ulong *)*plVar5;
          }
          local_110 = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
        }
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          uVar10 = local_138.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_110 + local_138._M_string_length) {
          uVar11 = 0xf;
          if (local_118 != &local_108) {
            uVar11 = local_108;
          }
          if (uVar11 < local_110 + local_138._M_string_length) goto LAB_001ce08e;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_118,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
        }
        else {
LAB_001ce08e:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_118);
        }
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_158.field_2._M_allocated_capacity = *psVar7;
          local_158.field_2._8_8_ = puVar6[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar7;
          local_158._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_158._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)psVar7 = 0;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_emplace_unique<std::__cxx11::string>(local_78,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (sVar3 != 0) {
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      ppEVar12 = ppEVar12 + 1;
    } while (ppEVar12 != ppEVar2);
  }
  return;
}

Assistant:

void import_generator(const std::vector<T *> &definitions,
                        const std::string &included,
                        std::set<std::string> &imports) {
    for (const auto &item : definitions) {
      if (item->file == included) {
        std::string component = namer_.Namespace(*item->defined_namespace);
        std::string filebase =
            flatbuffers::StripPath(flatbuffers::StripExtension(item->file));
        std::string filename =
            namer_.File(filebase + (component.empty() ? "" : "_" + component));

        imports.emplace("import './" + filename + "'" +
                        (component.empty()
                             ? ";\n"
                             : " as " + ImportAliasName(component) + ";\n"));
      }
    }
  }